

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

HttpInputStreamImpl *
kj::HttpServer::Connection::makeHttpInput
          (HttpInputStreamImpl *__return_storage_ptr__,AsyncIoStream *stream,HttpHeaderTable *table,
          Maybe<kj::HttpServer::SuspendedRequest> *suspendedRequest)

{
  StringPtr url;
  HttpHeaderTable *inner;
  HttpHeaders *pHVar1;
  HttpHeaders local_f8;
  char *local_98;
  size_t sStack_90;
  OneOf<kj::HttpMethod,_kj::HttpConnectMethod> local_80 [2];
  ArrayPtr<char> local_60;
  Array<char> local_50;
  SuspendedRequest *local_38;
  SuspendedRequest *sr;
  SuspendedRequest *_sr7473;
  Maybe<kj::HttpServer::SuspendedRequest> *suspendedRequest_local;
  HttpHeaderTable *table_local;
  AsyncIoStream *stream_local;
  
  _sr7473 = (SuspendedRequest *)suspendedRequest;
  suspendedRequest_local = (Maybe<kj::HttpServer::SuspendedRequest> *)table;
  table_local = (HttpHeaderTable *)stream;
  stream_local = (AsyncIoStream *)__return_storage_ptr__;
  local_38 = kj::_::readMaybe<kj::HttpServer::SuspendedRequest>(suspendedRequest);
  inner = table_local;
  sr = local_38;
  if (local_38 == (SuspendedRequest *)0x0) {
    anon_unknown_36::HttpInputStreamImpl::HttpInputStreamImpl
              (__return_storage_ptr__,(AsyncInputStream *)table_local,
               (HttpHeaderTable *)suspendedRequest_local);
  }
  else {
    Array<unsigned_char>::releaseAsChars(&local_50,&local_38->buffer);
    local_60 = ArrayPtr<unsigned_char>::asChars(&local_38->leftover);
    OneOf<kj::HttpMethod,_kj::HttpConnectMethod>::OneOf(local_80,&local_38->method);
    local_98 = (local_38->url).content.ptr;
    sStack_90 = (local_38->url).content.size_;
    pHVar1 = mv<kj::HttpHeaders>(&local_38->headers);
    HttpHeaders::HttpHeaders(&local_f8,pHVar1);
    url.content.size_ = sStack_90;
    url.content.ptr = local_98;
    anon_unknown_36::HttpInputStreamImpl::HttpInputStreamImpl
              (__return_storage_ptr__,(AsyncInputStream *)inner,&local_50,local_60,local_80,url,
               &local_f8);
    HttpHeaders::~HttpHeaders(&local_f8);
    OneOf<kj::HttpMethod,_kj::HttpConnectMethod>::~OneOf(local_80);
    Array<char>::~Array(&local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

static HttpInputStreamImpl makeHttpInput(
      kj::AsyncIoStream& stream,
      const kj::HttpHeaderTable& table,
      kj::Maybe<SuspendedRequest> suspendedRequest) {
    // Constructor helper function to create our HttpInputStreamImpl.

    KJ_IF_SOME(sr, suspendedRequest) {
      return HttpInputStreamImpl(stream,
          sr.buffer.releaseAsChars(),
          sr.leftover.asChars(),
          sr.method,
          sr.url,
          kj::mv(sr.headers));
    }
    return HttpInputStreamImpl(stream, table);
  }